

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::ProcessEvent(Event *event)

{
  EventType EVar1;
  long lVar2;
  bool bVar3;
  ImGuiIO *pIVar4;
  ulong uVar5;
  undefined1 uVar6;
  uint i;
  uint uVar7;
  
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x150,"void ImGui::SFML::ProcessEvent(const sf::Event &)");
  }
  if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x38) == '\x01') {
    pIVar4 = GetIO();
    lVar2 = (anonymous_namespace)::s_currWindowCtx;
    EVar1 = event->type;
    switch(EVar1) {
    case TextEntered:
      uVar7 = (event->field_1).size.width;
      if (uVar7 != 0x7f && 0x1f < uVar7) {
        ImGuiIO::AddInputCharacter(pIVar4,uVar7);
      }
      break;
    case KeyPressed:
    case KeyReleased:
      uVar5 = (ulong)(event->field_1).size.width;
      if (uVar5 < 0x285) {
        pIVar4->KeysDown[uVar5] = EVar1 == KeyPressed;
      }
      pIVar4->KeyCtrl = (event->field_1).key.control;
      pIVar4->KeyAlt = (event->field_1).key.alt;
      pIVar4->KeyShift = (event->field_1).key.shift;
      pIVar4->KeySuper = (event->field_1).key.system;
      break;
    case MouseWheelScrolled:
      uVar7 = (event->field_1).size.width;
      if (uVar7 != 0) {
        if (uVar7 != 1) break;
        if (pIVar4->KeyShift != true) {
          pIVar4->MouseWheelH = (event->field_1).mouseWheelScroll.delta + pIVar4->MouseWheelH;
          break;
        }
      }
      pIVar4->MouseWheel = (event->field_1).mouseWheelScroll.delta + pIVar4->MouseWheel;
      break;
    case MouseButtonPressed:
    case MouseButtonReleased:
      uVar7 = (event->field_1).size.width;
      if (uVar7 < 3 && EVar1 == MouseButtonPressed) {
        *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x3a + (ulong)uVar7) = 1;
      }
      break;
    case MouseMoved:
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 1;
      break;
    case JoystickConnected:
      if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x50) == 8) {
        *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = (event->field_1).size.width;
      }
      break;
    case JoystickDisconnected:
      if (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) == (event->field_1).size.width) {
        uVar7 = 0;
        do {
          bVar3 = sf::Joystick::isConnected(uVar7);
          if (bVar3) goto LAB_00146352;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 8);
        uVar7 = 8;
LAB_00146352:
        *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = uVar7;
      }
      break;
    case TouchBegan:
    case TouchEnded:
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 0;
      uVar7 = (event->field_1).size.width;
      if (uVar7 < 3 && EVar1 == TouchBegan) {
        *(undefined1 *)(lVar2 + 0x44 + (ulong)uVar7) = 1;
      }
    }
  }
  if (event->type == GainedFocus) {
    uVar6 = 1;
  }
  else {
    if (event->type != LostFocus) {
      return;
    }
    pIVar4 = GetIO();
    uVar6 = 0;
    memset(pIVar4->KeysDown,0,0x285);
    pIVar4->KeyCtrl = false;
    pIVar4->KeyShift = false;
    pIVar4->KeyAlt = false;
    pIVar4->KeySuper = false;
  }
  *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x38) = uVar6;
  return;
}

Assistant:

void ProcessEvent(const sf::Event& event) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");
    if (s_currWindowCtx->windowHasFocus) {
        ImGuiIO& io = ImGui::GetIO();

        switch (event.type) {
        case sf::Event::MouseMoved:
            s_currWindowCtx->mouseMoved = true;
            break;
        case sf::Event::MouseButtonPressed: // fall-through
        case sf::Event::MouseButtonReleased: {
            int button = event.mouseButton.button;
            if (event.type == sf::Event::MouseButtonPressed && button >= 0 && button < 3) {
                s_currWindowCtx->mousePressed[event.mouseButton.button] = true;
            }
        } break;
        case sf::Event::TouchBegan: // fall-through
        case sf::Event::TouchEnded: {
            s_currWindowCtx->mouseMoved = false;
            int button = event.touch.finger;
            if (event.type == sf::Event::TouchBegan && button >= 0 && button < 3) {
                s_currWindowCtx->touchDown[event.touch.finger] = true;
            }
        } break;
        case sf::Event::MouseWheelScrolled:
            if (event.mouseWheelScroll.wheel == sf::Mouse::VerticalWheel ||
                (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel && io.KeyShift)) {
                io.MouseWheel += event.mouseWheelScroll.delta;
            } else if (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel) {
                io.MouseWheelH += event.mouseWheelScroll.delta;
            }
            break;
        case sf::Event::KeyPressed: // fall-through
        case sf::Event::KeyReleased: {
            int key = event.key.code;
            if (key >= 0 && key < IM_ARRAYSIZE(io.KeysDown)) {
                io.KeysDown[key] = (event.type == sf::Event::KeyPressed);
            }
            io.KeyCtrl = event.key.control;
            io.KeyAlt = event.key.alt;
            io.KeyShift = event.key.shift;
            io.KeySuper = event.key.system;
        } break;
        case sf::Event::TextEntered:
            // Don't handle the event for unprintable characters
            if (event.text.unicode < ' ' || event.text.unicode == 127) {
                break;
            }
            io.AddInputCharacter(event.text.unicode);
            break;
        case sf::Event::JoystickConnected:
            if (s_currWindowCtx->joystickId == NULL_JOYSTICK_ID) {
                s_currWindowCtx->joystickId = event.joystickConnect.joystickId;
            }
            break;
        case sf::Event::JoystickDisconnected:
            if (s_currWindowCtx->joystickId == event.joystickConnect.joystickId) { // used gamepad
                                                                                   // was
                                                                                   // disconnected
                s_currWindowCtx->joystickId = getConnectedJoystickId();
            }
            break;
        default:
            break;
        }
    }

    switch (event.type) {
    case sf::Event::LostFocus: {
        // reset all input - SFML doesn't send KeyReleased
        // event when window goes out of focus
        ImGuiIO& io = ImGui::GetIO();
        for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); ++i) {
            io.KeysDown[i] = false;
        }
        io.KeyCtrl = false;
        io.KeyAlt = false;
        io.KeyShift = false;
        io.KeySuper = false;

        s_currWindowCtx->windowHasFocus = false;
    } break;
    case sf::Event::GainedFocus:
        s_currWindowCtx->windowHasFocus = true;
        break;
    default:
        break;
    }
}